

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int decode_key_share_entry(uint16_t *group,ptls_iovec_t *key_exchange,uint8_t **src,uint8_t *end)

{
  byte *pbVar1;
  long lVar2;
  long in_RCX;
  long *in_RDX;
  undefined8 *in_RSI;
  ptls_iovec_t pVar3;
  uint8_t *end_1;
  uint8_t *_src;
  uint64_t _block_size64;
  size_t _block_size;
  size_t _capacity;
  int ret;
  uint8_t *in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffffa0 [16];
  ulong local_38;
  long local_30;
  int local_24;
  
  local_24 = ptls_decode16(in_stack_ffffffffffffffa0._8_8_,in_stack_ffffffffffffffa0._0_8_,
                           in_stack_ffffffffffffff98);
  if (local_24 == 0) {
    local_30 = 2;
    if ((ulong)(in_RCX - *in_RDX) < 2) {
      local_24 = 0x32;
    }
    else {
      local_38 = 0;
      do {
        pbVar1 = (byte *)*in_RDX;
        *in_RDX = (long)(pbVar1 + 1);
        local_38 = local_38 << 8 | (ulong)*pbVar1;
        local_30 = local_30 + -1;
      } while (local_30 != 0);
      if ((ulong)(in_RCX - *in_RDX) < local_38) {
        local_24 = 0x32;
      }
      else {
        lVar2 = *in_RDX + local_38;
        pVar3 = ptls_iovec_init((void *)*in_RDX,lVar2 - *in_RDX);
        *in_RSI = pVar3.base;
        in_RSI[1] = pVar3.len;
        *in_RDX = lVar2;
        if (*in_RDX != lVar2) {
          local_24 = 0x32;
        }
      }
    }
  }
  return local_24;
}

Assistant:

static int decode_key_share_entry(uint16_t *group, ptls_iovec_t *key_exchange, const uint8_t **src, const uint8_t *const end)
{
    int ret;

    if ((ret = ptls_decode16(group, src, end)) != 0)
        goto Exit;
    ptls_decode_open_block(*src, end, 2, {
        *key_exchange = ptls_iovec_init(*src, end - *src);
        *src = end;
    });

Exit:
    return ret;
}